

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O2

uint32_t __thiscall
choc::text::FloatToStringBuffer<double>::generateDigits
          (FloatToStringBuffer<double> *this,char *buffer,MantissaAndExponent upperBound,
          uint64_t mantissaDiff,uint64_t delta,int *K)

{
  int iVar1;
  uint64_t tenToPowerNumDigits;
  ulong rest;
  uint32_t *puVar2;
  byte bVar3;
  uint length;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t diff;
  ulong uVar7;
  ulong uStack_60;
  
  diff = upperBound._8_8_;
  bVar3 = -(char)upperBound.mantissa;
  tenToPowerNumDigits = 1L << (bVar3 & 0x3f);
  uVar7 = tenToPowerNumDigits - 1 & (ulong)buffer;
  uVar5 = (ulong)buffer >> (bVar3 & 0x3f);
  iVar1 = math::getNumDecimalDigits((uint32_t)uVar5);
  length = 0;
  do {
    iVar1 = iVar1 + -1;
    iVar4 = (int)uVar5;
    switch(iVar1) {
    case 0:
      uVar5 = 0;
      break;
    case 1:
      uStack_60 = 10;
      goto LAB_00220784;
    case 2:
      uStack_60 = 100;
      goto LAB_00220784;
    case 3:
      uStack_60 = 1000;
      goto LAB_00220784;
    case 4:
      uStack_60 = 10000;
LAB_00220784:
      iVar4 = (int)((uVar5 & 0xffffffff) / uStack_60);
      uVar5 = (uVar5 & 0xffffffff) % uStack_60;
      break;
    case 5:
      iVar4 = (int)((uVar5 & 0xffffffff) / 100000);
      uVar5 = (uVar5 & 0xffffffff) % 100000;
      break;
    case 6:
      iVar4 = (int)((uVar5 & 0xffffffff) / 1000000);
      uVar5 = (uVar5 & 0xffffffff) % 1000000;
      break;
    case 7:
      iVar4 = (int)((uVar5 & 0xffffffff) / 10000000);
      uVar5 = (uVar5 & 0xffffffff) % 10000000;
      break;
    case 8:
      iVar4 = (int)((uVar5 & 0xffffffff) / 100000000);
      uVar5 = (uVar5 & 0xffffffff) % 100000000;
      break;
    default:
      uVar5 = uVar5 & 0xffffffff;
    }
    uVar6 = 0;
    if (iVar4 != 0 || length != 0) {
      this->storage[length] = (char)iVar4 + '0';
      uVar6 = (ulong)(length + 1);
    }
    rest = (uVar5 << (bVar3 & 0x3f)) + uVar7;
    length = (uint)uVar6;
    if (rest <= mantissaDiff) {
      *(int *)delta = *(int *)delta + iVar1;
      tenToPowerNumDigits = (ulong)powersOf10[iVar1] << (bVar3 & 0x3f);
      goto LAB_00220893;
    }
    if (iVar1 == 0) {
      puVar2 = powersOf10;
      iVar1 = 1;
      rest = uVar7;
      do {
        uVar7 = rest * 10 >> (bVar3 & 0x3f);
        uVar5 = 0;
        if ((int)uVar7 != 0 || (int)uVar6 != 0) {
          this->storage[uVar6] = (char)uVar7 + '0';
          uVar5 = (ulong)((int)uVar6 + 1);
        }
        uVar6 = uVar5;
        length = (uint)uVar6;
        mantissaDiff = mantissaDiff * 10;
        rest = rest * 10 & tenToPowerNumDigits - 1;
        puVar2 = puVar2 + 1;
        iVar1 = iVar1 + -1;
      } while (mantissaDiff <= rest);
      *(int *)delta = *(int *)delta + iVar1 + -1;
      if (iVar1 < -7) {
        diff = 0;
      }
      else {
        diff = *puVar2 * diff;
      }
LAB_00220893:
      roundFinalDigit(this->storage,length,mantissaDiff,rest,tenToPowerNumDigits,diff);
      return length;
    }
  } while( true );
}

Assistant:

static uint32_t generateDigits (char* buffer, MantissaAndExponent upperBound, uint64_t mantissaDiff, uint64_t delta, int& K)
    {
        uint32_t length = 0;
        const auto one = MantissaAndExponent { 1ull << -upperBound.exponent, upperBound.exponent };
        auto p1 = static_cast<uint32_t> (upperBound.mantissa >> -one.exponent);
        auto p2 = upperBound.mantissa & (one.mantissa - 1);
        auto numDigits = math::getNumDecimalDigits (p1);

        for (;;)
        {
            auto digit = p1;

            switch (--numDigits)
            {
                case 0:                           p1 = 0;              break;
                case 1:  digit /= powersOf10[1];  p1 %= powersOf10[1]; break;
                case 2:  digit /= powersOf10[2];  p1 %= powersOf10[2]; break;
                case 3:  digit /= powersOf10[3];  p1 %= powersOf10[3]; break;
                case 4:  digit /= powersOf10[4];  p1 %= powersOf10[4]; break;
                case 5:  digit /= powersOf10[5];  p1 %= powersOf10[5]; break;
                case 6:  digit /= powersOf10[6];  p1 %= powersOf10[6]; break;
                case 7:  digit /= powersOf10[7];  p1 %= powersOf10[7]; break;
                case 8:  digit /= powersOf10[8];  p1 %= powersOf10[8]; break;
                default: break;
            }

            writeDigitIfNotLeadingZero (buffer, length, digit);
            auto rest = p2 + (static_cast<uint64_t> (p1) << -one.exponent);

            if (rest <= delta)
            {
                K += numDigits;
                roundFinalDigit (buffer, length, delta, rest, static_cast<uint64_t> (powersOf10[numDigits]) << -one.exponent, mantissaDiff);
                return length;
            }

            if (numDigits == 0)
            {
                for (;;)
                {
                    delta *= 10;
                    p2 *= 10;
                    --numDigits;
                    writeDigitIfNotLeadingZero (buffer, length, static_cast<uint32_t> (p2 >> -one.exponent));
                    p2 &= one.mantissa - 1;

                    if (p2 < delta)
                    {
                        K += numDigits;
                        roundFinalDigit (buffer, length, delta, p2, one.mantissa, numDigits > -9 ? mantissaDiff * powersOf10[-numDigits] : 0);
                        return length;
                    }
                }
            }
        }
    }